

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_location_impl.hpp
# Opt level: O0

ostringstream * toml::detail::format_empty_line(ostringstream *oss,size_t lnw)

{
  ostream *poVar1;
  void *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  ostream *in_RDI;
  char in_stack_ffffffffffffffc7;
  size_t in_stack_ffffffffffffffc8;
  string local_30 [40];
  ostringstream *local_8;
  
  local_8 = (ostringstream *)in_RDI;
  make_string_abi_cxx11_(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc7);
  poVar1 = std::operator<<(in_RDI,local_30);
  this = (void *)std::ostream::operator<<(poVar1,color::ansi::bold);
  poVar1 = (ostream *)std::ostream::operator<<(this,color::ansi::blue);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::operator<<(poVar1," |\n");
  std::ostream::operator<<(this_00,color::ansi::reset);
  std::__cxx11::string::~string(this_00);
  return local_8;
}

Assistant:

TOML11_INLINE std::ostringstream& format_empty_line(std::ostringstream& oss,
        const std::size_t lnw)
{
    //    |
    oss << detail::make_string(lnw + 1, ' ')
        << color::bold << color::blue << " |\n"  << color::reset;
    return oss;
}